

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O2

string * __thiscall
cmQtAutoGen::FileNameWithoutLastExtension_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGen *this,string_view filename)

{
  size_type sVar1;
  allocator<char> local_31;
  string_view filename_local;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  filename_local._M_str = (char *)filename._M_len;
  filename_local._M_len = (size_t)this;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                    (&filename_local,'/',0xffffffffffffffff);
  if (sVar1 != 0xffffffffffffffff) {
    filename_local._M_str = filename_local._M_str + sVar1 + 1;
    filename_local._M_len = filename_local._M_len - (sVar1 + 1);
  }
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                    (&filename_local,'.',0xffffffffffffffff);
  local_20 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&filename_local,0,sVar1);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,&local_20,&local_31);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::FileNameWithoutLastExtension(cm::string_view filename)
{
  auto slashPos = filename.rfind('/');
  if (slashPos != cm::string_view::npos) {
    filename.remove_prefix(slashPos + 1);
  }
  auto dotPos = filename.rfind('.');
  return std::string(filename.substr(0, dotPos));
}